

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O0

void MultipleAllocations(bool *result)

{
  TestClass2 *pTVar1;
  int local_e4;
  int local_e0;
  int i_2;
  int i_1;
  int local_cc;
  int i;
  TestClass2 *testArray2 [10];
  TestClass1 *testArray1 [10];
  ulong local_20;
  uint64_t memLeakSize;
  size_t memLeakCount;
  bool *result_local;
  
  memLeakCount = (size_t)result;
  MemPlumber::start(false,"",false);
  for (local_cc = 0; local_cc < 10; local_cc = local_cc + 1) {
    pTVar1 = (TestClass2 *)operator_new(4);
    *(undefined4 *)pTVar1 = 0;
    testArray2[(long)local_cc + 9] = pTVar1;
    pTVar1 = (TestClass2 *)operator_new(0x30);
    TestClass2::TestClass2(pTVar1);
    *(TestClass2 **)(&stack0xffffffffffffff38 + (long)local_cc * 8) = pTVar1;
  }
  MemPlumber::memLeakCheck(&memLeakSize,&local_20,false,"",false);
  if (memLeakSize == 0x1e) {
    if (local_20 == 600) {
      for (local_e0 = 0; local_e0 < 10; local_e0 = local_e0 + 1) {
        pTVar1 = *(TestClass2 **)(&stack0xffffffffffffff38 + (long)local_e0 * 8);
        if (pTVar1 != (TestClass2 *)0x0) {
          TestClass2::~TestClass2(pTVar1);
          operator_delete(pTVar1,0x30);
        }
      }
      MemPlumber::memLeakCheck(&memLeakSize,&local_20,false,"",false);
      if (memLeakSize == 10) {
        if (local_20 == 0x28) {
          for (local_e4 = 0; local_e4 < 10; local_e4 = local_e4 + 1) {
            if (testArray2[(long)local_e4 + 9] != (TestClass2 *)0x0) {
              operator_delete(testArray2[(long)local_e4 + 9],4);
            }
          }
          MemPlumber::memLeakCheck(&memLeakSize,&local_20,false,"",false);
          if (memLeakSize == 0) {
            if (local_20 == 0) {
              MemPlumber::stopAndFreeAllMemory();
            }
            else {
              printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                     "MultipleAllocations",0x5f,local_20 & 0xffffffff,0);
              *(undefined1 *)memLeakCount = 0;
            }
          }
          else {
            printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                   "MultipleAllocations",0x5f,memLeakSize & 0xffffffff,0);
            *(undefined1 *)memLeakCount = 0;
          }
        }
        else {
          printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                 "MultipleAllocations",0x59,local_20 & 0xffffffff,0x28);
          *(undefined1 *)memLeakCount = 0;
        }
      }
      else {
        printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
               "MultipleAllocations",0x59,memLeakSize & 0xffffffff,10);
        *(undefined1 *)memLeakCount = 0;
      }
    }
    else {
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
             "MultipleAllocations",0x53,local_20 & 0xffffffff,600);
      *(undefined1 *)memLeakCount = 0;
    }
  }
  else {
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultipleAllocations",
           0x53,memLeakSize & 0xffffffff,0x1e);
    *(undefined1 *)memLeakCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(MultipleAllocations) {

    START_TEST;

    TestClass1* testArray1[10];
    TestClass2* testArray2[10];

    for (int i = 0; i < 10; i++) {
        testArray1[i] = new TestClass1();
        testArray2[i] = new TestClass2();
    }

    CHECK_MEM_LEAK(30, 10*(sizeof(TestClass1) + sizeof(TestClass2) + sizeof(double)));

    for (int i = 0; i < 10; i++) {
        delete testArray2[i];
    }

    CHECK_MEM_LEAK(10, 10*sizeof(TestClass1));

    for (int i = 0; i < 10; i++) {
        delete testArray1[i];
    }

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}